

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * __thiscall
cmGeneratorTarget::GetOutputTargetType(cmGeneratorTarget *this,ArtifactType artifact)

{
  bool bVar1;
  int iVar2;
  TargetType TVar3;
  char *pcVar4;
  char *pcVar5;
  
  bVar1 = cmTarget::IsFrameworkOnApple(this->Target);
  if ((bVar1) ||
     (iVar2 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])(),
     (char)iVar2 != '\0')) {
    artifact = RuntimeBinaryArtifact;
  }
  TVar3 = cmTarget::GetType(this->Target);
  switch(TVar3) {
  case EXECUTABLE:
    pcVar5 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar5 = "ARCHIVE";
    }
    pcVar4 = "RUNTIME";
    goto LAB_00492b05;
  case STATIC_LIBRARY:
    pcVar4 = "ARCHIVE";
    break;
  case SHARED_LIBRARY:
    bVar1 = cmTarget::IsDLLPlatform(this->Target);
    pcVar4 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar4 = "ARCHIVE";
    }
    if (bVar1) {
      pcVar5 = "RUNTIME";
    }
    else {
      pcVar5 = "LIBRARY";
    }
    if (artifact == RuntimeBinaryArtifact) {
      pcVar4 = pcVar5;
    }
    break;
  case MODULE_LIBRARY:
    pcVar5 = "";
    if (artifact == ImportLibraryArtifact) {
      pcVar5 = "ARCHIVE";
    }
    pcVar4 = "LIBRARY";
LAB_00492b05:
    if (artifact != RuntimeBinaryArtifact) {
      pcVar4 = pcVar5;
    }
    break;
  case OBJECT_LIBRARY:
    pcVar4 = "OBJECT";
    break;
  default:
    pcVar4 = "";
  }
  return pcVar4;
}

Assistant:

const char* cmGeneratorTarget::GetOutputTargetType(
  cmStateEnums::ArtifactType artifact) const
{
  if (this->IsFrameworkOnApple() || this->GetGlobalGenerator()->IsXcode()) {
    // import file (i.e. .tbd file) is always in same location as library
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  switch (this->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
      if (this->IsDLLPlatform()) {
        switch (artifact) {
          case cmStateEnums::RuntimeBinaryArtifact:
            // A DLL shared library is treated as a runtime target.
            return "RUNTIME";
          case cmStateEnums::ImportLibraryArtifact:
            // A DLL import library is treated as an archive target.
            return "ARCHIVE";
        }
      } else {
        switch (artifact) {
          case cmStateEnums::RuntimeBinaryArtifact:
            // For non-DLL platforms shared libraries are treated as
            // library targets.
            return "LIBRARY";
          case cmStateEnums::ImportLibraryArtifact:
            // Library import libraries are treated as archive targets.
            return "ARCHIVE";
        }
      }
      break;
    case cmStateEnums::STATIC_LIBRARY:
      // Static libraries are always treated as archive targets.
      return "ARCHIVE";
    case cmStateEnums::MODULE_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Module libraries are always treated as library targets.
          return "LIBRARY";
        case cmStateEnums::ImportLibraryArtifact:
          // Module import libraries are treated as archive targets.
          return "ARCHIVE";
      }
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      // Object libraries are always treated as object targets.
      return "OBJECT";
    case cmStateEnums::EXECUTABLE:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Executables are always treated as runtime targets.
          return "RUNTIME";
        case cmStateEnums::ImportLibraryArtifact:
          // Executable import libraries are treated as archive targets.
          return "ARCHIVE";
      }
      break;
    default:
      break;
  }
  return "";
}